

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void * xmlHashQLookup3(xmlHashTablePtr hash,xmlChar *prefix,xmlChar *name,xmlChar *prefix2,
                      xmlChar *name2,xmlChar *prefix3,xmlChar *name3)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  uint local_58;
  uint local_54;
  uint displ;
  uint pos;
  uint mask;
  uint hashValue;
  xmlHashEntry *entry;
  xmlChar *prefix3_local;
  xmlChar *name2_local;
  xmlChar *prefix2_local;
  xmlChar *name_local;
  xmlChar *prefix_local;
  xmlHashTablePtr hash_local;
  
  if (((hash != (xmlHashTablePtr)0x0) && (hash->size != 0)) && (name != (xmlChar *)0x0)) {
    uVar1 = xmlHashQNameValue(hash->randomSeed,prefix,name,prefix2,name2,prefix3,name3);
    uVar2 = hash->size - 1;
    local_54 = uVar1 & uVar2;
    _mask = hash->table + local_54;
    if (_mask->hashValue != 0) {
      local_58 = 0;
      do {
        if ((((uVar1 | 0x80000000) == _mask->hashValue) &&
            (iVar3 = xmlStrQEqual(prefix,name,_mask->key), iVar3 != 0)) &&
           ((iVar3 = xmlStrQEqual(prefix2,name2,_mask->key2), iVar3 != 0 &&
            (iVar3 = xmlStrQEqual(prefix3,name3,_mask->key3), iVar3 != 0)))) {
          return _mask->payload;
        }
        local_58 = local_58 + 1;
        local_54 = local_54 + 1;
        _mask = _mask + 1;
        if ((local_54 & uVar2) == 0) {
          _mask = hash->table;
        }
        bVar4 = false;
        if (_mask->hashValue != 0) {
          bVar4 = local_58 <= (local_54 - _mask->hashValue & uVar2);
        }
      } while (bVar4);
    }
  }
  return (void *)0x0;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
void *
xmlHashQLookup3(xmlHashTablePtr hash,
                const xmlChar *prefix, const xmlChar *name,
                const xmlChar *prefix2, const xmlChar *name2,
                const xmlChar *prefix3, const xmlChar *name3) {
    const xmlHashEntry *entry;
    unsigned hashValue, mask, pos, displ;

    if ((hash == NULL) || (hash->size == 0) || (name == NULL))
        return(NULL);

    hashValue = xmlHashQNameValue(hash->randomSeed, prefix, name, prefix2,
                                  name2, prefix3, name3);
    mask = hash->size - 1;
    pos = hashValue & mask;
    entry = &hash->table[pos];

    if (entry->hashValue != 0) {
        displ = 0;
        hashValue |= MAX_HASH_SIZE;

        do {
            if ((hashValue == entry->hashValue) &&
                (xmlStrQEqual(prefix, name, entry->key)) &&
                (xmlStrQEqual(prefix2, name2, entry->key2)) &&
                (xmlStrQEqual(prefix3, name3, entry->key3)))
                return(entry->payload);

            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = hash->table;
        } while ((entry->hashValue != 0) &&
                 (((pos - entry->hashValue) & mask) >= displ));
    }

    return(NULL);
}